

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VEnableFusedOps_Serial(N_Vector v,int tf)

{
  N_Vector_Ops p_Var1;
  
  p_Var1 = v->ops;
  if (tf == 0) {
    p_Var1->nvdotprodmultilocal = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvscaleaddmultivectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)
         0x0;
    p_Var1->nvlinearcombinationvectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvwrmsnormvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvwrmsnormmaskvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *)0x0;
    p_Var1->nvscalevectorarray =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvconstvectorarray = (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr *)0x0;
    p_Var1->nvdotprodmulti = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvlinearsumvectorarray =
         (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvlinearcombination = (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *)0x0;
    p_Var1->nvscaleaddmulti =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0;
  }
  else {
    p_Var1->nvlinearcombination = N_VLinearCombination_Serial;
    p_Var1->nvscaleaddmulti = N_VScaleAddMulti_Serial;
    p_Var1->nvdotprodmulti = N_VDotProdMulti_Serial;
    p_Var1->nvlinearsumvectorarray = N_VLinearSumVectorArray_Serial;
    p_Var1->nvscalevectorarray = N_VScaleVectorArray_Serial;
    p_Var1->nvconstvectorarray = N_VConstVectorArray_Serial;
    p_Var1->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_Serial;
    p_Var1->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_Serial;
    p_Var1->nvscaleaddmultivectorarray = N_VScaleAddMultiVectorArray_Serial;
    p_Var1->nvlinearcombinationvectorarray = N_VLinearCombinationVectorArray_Serial;
    p_Var1->nvdotprodmultilocal = N_VDotProdMulti_Serial;
  }
  return 0;
}

Assistant:

SUNErrCode N_VEnableFusedOps_Serial(N_Vector v, sunbooleantype tf)
{
  if (tf)
  {
    /* enable all fused vector operations */
    v->ops->nvlinearcombination = N_VLinearCombination_Serial;
    v->ops->nvscaleaddmulti     = N_VScaleAddMulti_Serial;
    v->ops->nvdotprodmulti      = N_VDotProdMulti_Serial;
    /* enable all vector array operations */
    v->ops->nvlinearsumvectorarray     = N_VLinearSumVectorArray_Serial;
    v->ops->nvscalevectorarray         = N_VScaleVectorArray_Serial;
    v->ops->nvconstvectorarray         = N_VConstVectorArray_Serial;
    v->ops->nvwrmsnormvectorarray      = N_VWrmsNormVectorArray_Serial;
    v->ops->nvwrmsnormmaskvectorarray  = N_VWrmsNormMaskVectorArray_Serial;
    v->ops->nvscaleaddmultivectorarray = N_VScaleAddMultiVectorArray_Serial;
    v->ops->nvlinearcombinationvectorarray =
      N_VLinearCombinationVectorArray_Serial;
    /* enable single buffer reduction operations */
    v->ops->nvdotprodmultilocal = N_VDotProdMulti_Serial;
  }
  else
  {
    /* disable all fused vector operations */
    v->ops->nvlinearcombination = NULL;
    v->ops->nvscaleaddmulti     = NULL;
    v->ops->nvdotprodmulti      = NULL;
    /* disable all vector array operations */
    v->ops->nvlinearsumvectorarray         = NULL;
    v->ops->nvscalevectorarray             = NULL;
    v->ops->nvconstvectorarray             = NULL;
    v->ops->nvwrmsnormvectorarray          = NULL;
    v->ops->nvwrmsnormmaskvectorarray      = NULL;
    v->ops->nvscaleaddmultivectorarray     = NULL;
    v->ops->nvlinearcombinationvectorarray = NULL;
    /* disable single buffer reduction operations */
    v->ops->nvdotprodmultilocal = NULL;
  }

  /* return success */
  return SUN_SUCCESS;
}